

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BIEN.hpp
# Opt level: O0

void __thiscall Bioengineering::Bioengineering(Bioengineering *this)

{
  Bioengineering *this_local;
  
  AbstractMajor::AbstractMajor(&this->super_AbstractMajor);
  (this->super_AbstractMajor)._vptr_AbstractMajor = (_func_int **)&PTR_getName_abi_cxx11__001f7708;
  std::__cxx11::string::operator=((string *)&(this->super_AbstractMajor).name,"bien");
  return;
}

Assistant:

Bioengineering() : AbstractMajor() {
            this->name = "bien";
        }